

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_var(JSParseState *s,int parse_flags,int tok,BOOL export_flag)

{
  int iVar1;
  JSAtom opcode_00;
  JSExportEntry *pJVar2;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  JSModuleDef *in_RDI;
  BOOL unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  int skip_bits;
  JSAtom name1;
  int label;
  int scope;
  int opcode;
  JSAtom name;
  JSFunctionDef *fd;
  JSContext *ctx;
  BOOL in_stack_00000074;
  int in_stack_00000078;
  int in_stack_0000007c;
  int in_stack_00000080;
  int in_stack_00000084;
  JSParseState *in_stack_00000088;
  BOOL in_stack_000000dc;
  int *in_stack_000000e0;
  JSParseState *in_stack_000000e8;
  JSExportTypeEnum in_stack_ffffffffffffff9c;
  JSAtom in_stack_ffffffffffffffa0;
  JSAtom in_stack_ffffffffffffffa4;
  JSModuleDef *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  undefined3 uVar3;
  JSAtom in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  PutLValueEnum in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  JSAtom in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  JSValueUnion s_00;
  int *pscope;
  BOOL in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pscope = *(int **)in_RDI;
  s_00 = (in_RDI->func_obj).u;
  do {
    if (((JSToken *)&in_RDI->req_module_entries)->val == -0x7d) {
      if (in_RDI->export_entries_count != 0) {
        iVar1 = js_parse_error_reserved_identifier
                          ((JSParseState *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
        return iVar1;
      }
      opcode_00 = JS_DupAtom((JSContext *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (JSAtom)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      if ((opcode_00 == 0x27) && ((in_EDX == -0x2f || (in_EDX == -0x37)))) {
        js_parse_error((JSParseState *)in_RDI,"\'let\' is not a valid lexical identifier");
LAB_0019d18f:
        JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c);
        return -1;
      }
      iVar1 = next_token((JSParseState *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if ((iVar1 != 0) ||
         ((iVar1 = js_define_var((JSParseState *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0), iVar1 != 0 ||
          ((in_ECX != 0 &&
           (pJVar2 = add_export_entry((JSParseState *)
                                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                      in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                                      in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c),
           pJVar2 == (JSExportEntry *)0x0)))))) goto LAB_0019d18f;
      if (((JSToken *)&in_RDI->req_module_entries)->val == 0x3d) {
        iVar1 = next_token((JSParseState *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (iVar1 != 0) goto LAB_0019d18f;
        if (in_EDX == -0x4f) {
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (uint8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
          emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c);
          emit_u16((JSParseState *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (uint16_t)(in_stack_ffffffffffffff9c >> 0x10));
          in_stack_ffffffffffffffa0 = 0x3d;
          iVar1 = get_lvalue((JSParseState *)CONCAT44(in_ESI,in_EDX),
                             (int *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),pscope,
                             (JSAtom *)s_00.ptr,(int *)CONCAT44(opcode_00,in_stack_ffffffffffffffc8)
                             ,(int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             unaff_retaddr,in_stack_00000008);
          if (iVar1 < 0) goto LAB_0019d18f;
          iVar1 = js_parse_assign_expr2
                            ((JSParseState *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                             unaff_retaddr_00);
          if (iVar1 != 0) {
            JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
            goto LAB_0019d18f;
          }
          set_object_name((JSParseState *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
          put_lvalue((JSParseState *)s_00.ptr,opcode_00,in_stack_ffffffffffffffc8,
                     in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                     in_stack_ffffffffffffffe0);
        }
        else {
          iVar1 = js_parse_assign_expr2
                            ((JSParseState *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                             unaff_retaddr_00);
          if (iVar1 != 0) goto LAB_0019d18f;
          set_object_name((JSParseState *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
          uVar3 = (undefined3)in_stack_ffffffffffffffb4;
          in_stack_ffffffffffffffb4 = CONCAT13(1,uVar3);
          if (in_EDX != -0x37) {
            in_stack_ffffffffffffffb4 = CONCAT13(in_EDX == -0x2f,uVar3);
          }
          in_stack_ffffffffffffffa8 = in_RDI;
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (uint8_t)((ulong)in_RDI >> 0x38));
          emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c);
          emit_u16((JSParseState *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (uint16_t)(in_stack_ffffffffffffff9c >> 0x10));
        }
      }
      else {
        if (in_EDX == -0x37) {
          js_parse_error((JSParseState *)in_RDI,"missing initializer for const variable");
          goto LAB_0019d18f;
        }
        if (in_EDX == -0x2f) {
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (uint8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (uint8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
          emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c);
          emit_u16((JSParseState *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (uint16_t)(in_stack_ffffffffffffff9c >> 0x10));
        }
      }
      JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff9c);
    }
    else {
      if (((((JSToken *)&in_RDI->req_module_entries)->val != 0x5b) &&
          (((JSToken *)&in_RDI->req_module_entries)->val != 0x7b)) ||
         (iVar1 = js_parse_skip_parens_token(in_stack_000000e8,in_stack_000000e0,in_stack_000000dc),
         iVar1 != 0x3d)) {
        iVar1 = js_parse_error((JSParseState *)in_RDI,"variable name expected");
        return iVar1;
      }
      emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
              (uint8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
      iVar1 = js_parse_destructuring_element
                        (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_0000007c,
                         in_stack_00000078,in_stack_00000074);
      if (iVar1 < 0) {
        return -1;
      }
    }
    if (((JSToken *)&in_RDI->req_module_entries)->val != 0x2c) {
      return 0;
    }
    iVar1 = next_token((JSParseState *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                      );
    if (iVar1 != 0) {
      return -1;
    }
  } while( true );
}

Assistant:

static __exception int js_parse_var(JSParseState *s, int parse_flags, int tok,
                                    BOOL export_flag)
{
    JSContext *ctx = s->ctx;
    JSFunctionDef *fd = s->cur_func;
    JSAtom name = JS_ATOM_NULL;

    for (;;) {
        if (s->token.val == TOK_IDENT) {
            if (s->token.u.ident.is_reserved) {
                return js_parse_error_reserved_identifier(s);
            }
            name = JS_DupAtom(ctx, s->token.u.ident.atom);
            if (name == JS_ATOM_let && (tok == TOK_LET || tok == TOK_CONST)) {
                js_parse_error(s, "'let' is not a valid lexical identifier");
                goto var_error;
            }
            if (next_token(s))
                goto var_error;
            if (js_define_var(s, name, tok))
                goto var_error;
            if (export_flag) {
                if (!add_export_entry(s, s->cur_func->module, name, name,
                                      JS_EXPORT_TYPE_LOCAL))
                    goto var_error;
            }

            if (s->token.val == '=') {
                if (next_token(s))
                    goto var_error;
                if (tok == TOK_VAR) {
                    /* Must make a reference for proper `with` semantics */
                    int opcode, scope, label;
                    JSAtom name1;

                    emit_op(s, OP_scope_get_var);
                    emit_atom(s, name);
                    emit_u16(s, fd->scope_level);
                    if (get_lvalue(s, &opcode, &scope, &name1, &label, NULL, FALSE, '=') < 0)
                        goto var_error;
                    if (js_parse_assign_expr2(s, parse_flags)) {
                        JS_FreeAtom(ctx, name1);
                        goto var_error;
                    }
                    set_object_name(s, name);
                    put_lvalue(s, opcode, scope, name1, label,
                               PUT_LVALUE_NOKEEP, FALSE);
                } else {
                    if (js_parse_assign_expr2(s, parse_flags))
                        goto var_error;
                    set_object_name(s, name);
                    emit_op(s, (tok == TOK_CONST || tok == TOK_LET) ?
                        OP_scope_put_var_init : OP_scope_put_var);
                    emit_atom(s, name);
                    emit_u16(s, fd->scope_level);
                }
            } else {
                if (tok == TOK_CONST) {
                    js_parse_error(s, "missing initializer for const variable");
                    goto var_error;
                }
                if (tok == TOK_LET) {
                    /* initialize lexical variable upon entering its scope */
                    emit_op(s, OP_undefined);
                    emit_op(s, OP_scope_put_var_init);
                    emit_atom(s, name);
                    emit_u16(s, fd->scope_level);
                }
            }
            JS_FreeAtom(ctx, name);
        } else {
            int skip_bits;
            if ((s->token.val == '[' || s->token.val == '{')
            &&  js_parse_skip_parens_token(s, &skip_bits, FALSE) == '=') {
                emit_op(s, OP_undefined);
                if (js_parse_destructuring_element(s, tok, 0, TRUE, skip_bits & SKIP_HAS_ELLIPSIS, TRUE) < 0)
                    return -1;
            } else {
                return js_parse_error(s, "variable name expected");
            }
        }
        if (s->token.val != ',')
            break;
        if (next_token(s))
            return -1;
    }
    return 0;

 var_error:
    JS_FreeAtom(ctx, name);
    return -1;
}